

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O3

void __thiscall DynamicGraph::visualize(DynamicGraph *this,ostream *strm)

{
  _Rb_tree_header *p_Var1;
  pointer *ppsVar2;
  char cVar3;
  pointer puVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ulong uVar8;
  long lVar9;
  DynamicGraph *pDVar10;
  ostream *poVar11;
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subgraphs;
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,this->nextComponent,(allocator_type *)&local_50);
  lVar9 = 0;
  for (uVar8 = 0; uVar5 = this->nextComponent, uVar8 < uVar5; uVar8 = uVar8 + 1) {
    poVar11 = (ostream *)
              (local_68.
               super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  subgraph cluster",0x12);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,(int)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," { label = \"Component ",0x16);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,(int)uVar8 + 1);
    lVar9 = lVar9 + 0x178;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
  }
  puVar4 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    uVar8 = 0;
    do {
      poVar11 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)
                           (local_68.
                            super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           puVar4[uVar8] * 0x178 + -0x178),(int)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      uVar8 = uVar8 + 1;
      puVar4 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->components).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
    uVar5 = this->nextComponent;
  }
  if (uVar5 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (local_68.
                  super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9)," }\n",3);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x178;
    } while (uVar8 < this->nextComponent);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"graph G {",9);
  cVar3 = (char)strm;
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  size=\"5,3\"",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  ratio=\"fill\"",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  edge[style=\"bold\"]",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  node[shape=\"circle\"]",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (this->nextComponent != 0) {
    uVar8 = 0;
    do {
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(strm,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->nextComponent);
  }
  p_Var1 = &(this->virtualEdges)._M_t._M_impl.super__Rb_tree_header;
  pDVar10 = this;
  while (pDVar10 = *(DynamicGraph **)
                    &(pDVar10->super_UndirectedGraph).super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node.super__List_node_base, pDVar10 != this) {
    std::__ostream_insert<char,std::char_traits<char>>(strm,"  ",2);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," -- ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    p_Var6 = (this->virtualEdges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      ppsVar2 = &(pDVar10->super_UndirectedGraph).super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(undefined1 **)((long)(p_Var6 + 1) + 0x10) >= ppsVar2) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(undefined1 **)((long)(p_Var6 + 1) + 0x10) < ppsVar2];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (*(undefined1 **)((long)p_Var7 + 0x28 + 8) <= ppsVar2)) {
        std::__ostream_insert<char,std::char_traits<char>>(strm," [style=dotted]",0xf);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(strm,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void DynamicGraph::visualize(std::ostream &strm) const
{
    // Creating components streams
    std::vector<std::ostringstream> subgraphs(this->nextComponent);
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << "  subgraph cluster" << i << " { label = \"Component " << i+1 << "\" ";
    }
    for(int i = 0; i<this->components.size(); ++i) {
        subgraphs[components[i]-1] << i << "; ";
    }
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << " }\n";
    }

    // Printing graph style
    strm << "graph G {" << std::endl;
    strm << "  size=\"5,3\"" << std::endl;
    strm << "  ratio=\"fill\"" << std::endl;
    strm << "  edge[style=\"bold\"]" << std::endl;
    strm << "  node[shape=\"circle\"]" << std::endl;
    // Print subgraphs by vertices
    for(int i = 0; i<this->nextComponent; ++i) {
        strm  << subgraphs[i].str();
    }
    // Print edges
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = edges(*this); ei != ei_end; ++ei) {
        Vertex u,v;
        Edge e = *ei;
        u = source(e, *this);
        v = target(e, *this);
        strm << "  " << u << " -- " << v;
        if (virtualEdges.count(*ei)) strm << " [style=dotted]";
        strm << ";" << std::endl;
    }

    strm << "}" << std::endl;
}